

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_amigahunk.c
# Opt level: O2

void unsupp_relocs(LinkedSection *sec)

{
  node *pnVar1;
  node *pnVar2;
  
  while( true ) {
    pnVar2 = remhead(&sec->relocs);
    if (pnVar2 == (node *)0x0) break;
    pnVar1 = pnVar2[3].next;
    error(0x20,fff_amigahunk.tname,reloc_name[*(byte *)&pnVar2[3].pred],
          (ulong)*(ushort *)&pnVar1->pred,(ulong)*(ushort *)((long)&pnVar1->pred + 2),pnVar1[1].next
          ,sec->name,pnVar2[2].next);
  }
  return;
}

Assistant:

static void unsupp_relocs(struct LinkedSection *sec)
{
  struct Reloc *rel;

  while (rel = (struct Reloc *)remhead(&sec->relocs)) {
    error(32,fff_amigahunk.tname,reloc_name[rel->rtype],
          (int)rel->insert->bpos,(int)rel->insert->bsiz,
          rel->insert->mask,sec->name,rel->offset);
  }
}